

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_proxy.c
# Opt level: O2

void Curl_connect_done(Curl_easy *data)

{
  undefined1 *puVar1;
  http_connect_state *phVar2;
  
  phVar2 = data->conn->connect_state;
  if ((phVar2 != (http_connect_state *)0x0) && (phVar2->tunnel_state != TUNNEL_EXIT)) {
    phVar2->tunnel_state = TUNNEL_EXIT;
    Curl_dyn_free(&phVar2->rcvbuf);
    Curl_dyn_free(&phVar2->req);
    (data->req).p = (anon_union_8_12_57927972_for_p)phVar2->prot_save;
    (data->info).httpcode = 0;
    puVar1 = &(data->req).field_0xd9;
    *puVar1 = *puVar1 & 0xf7;
    Curl_infof(data,"CONNECT phase completed");
    return;
  }
  return;
}

Assistant:

void Curl_connect_done(struct Curl_easy *data)
{
  struct connectdata *conn = data->conn;
  struct http_connect_state *s = conn->connect_state;
  if(s && (s->tunnel_state != TUNNEL_EXIT)) {
    s->tunnel_state = TUNNEL_EXIT;
    Curl_dyn_free(&s->rcvbuf);
    Curl_dyn_free(&s->req);

    /* restore the protocol pointer */
    data->req.p.http = s->prot_save;
    data->info.httpcode = 0; /* clear it as it might've been used for the
                                proxy */
    data->req.ignorebody = FALSE;
#ifdef USE_HYPER
    data->state.hconnect = FALSE;
#endif
    infof(data, "CONNECT phase completed");
  }
}